

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

int Map_MappingGetMaxLevel(Map_Man_t *pMan)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  if (0 < (long)pMan->nOutputs) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = *(uint *)(((ulong)pMan->pOutputs[lVar2] & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
      if (uVar1 <= uVar3) {
        uVar1 = uVar3;
      }
      lVar2 = lVar2 + 1;
    } while (pMan->nOutputs != lVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

int Map_MappingGetMaxLevel( Map_Man_t * pMan )
{
    int nLevelMax, i;
    nLevelMax = 0;
    for ( i = 0; i < pMan->nOutputs; i++ )
        nLevelMax = ((unsigned)nLevelMax) > Map_Regular(pMan->pOutputs[i])->Level? 
                nLevelMax : Map_Regular(pMan->pOutputs[i])->Level;
    return nLevelMax;
}